

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lista.cpp
# Opt level: O3

void __thiscall
Lista::Lista(Lista *this,string *nume,string *data,ReadingTracker *rt,MoodTracker *md)

{
  pointer pcVar1;
  
  this->_vptr_Lista = (_func_int **)&PTR__Lista_0010dbe0;
  (this->nume)._M_dataplus._M_p = (pointer)&(this->nume).field_2;
  pcVar1 = (nume->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->nume,pcVar1,pcVar1 + nume->_M_string_length);
  (this->data)._M_dataplus._M_p = (pointer)&(this->data).field_2;
  pcVar1 = (data->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->data,pcVar1,pcVar1 + data->_M_string_length);
  (this->Taskuri).super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Taskuri).super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Taskuri).super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rt).super_Tracker._vptr_Tracker = (_func_int **)&PTR___cxa_pure_virtual_0010dc40;
  (this->rt).super_Tracker.nume._M_dataplus._M_p = (pointer)&(this->rt).super_Tracker.nume.field_2;
  pcVar1 = (rt->super_Tracker).nume._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->rt).super_Tracker.nume,pcVar1,
             pcVar1 + (rt->super_Tracker).nume._M_string_length);
  (this->rt).super_Tracker.stare._M_dataplus._M_p = (pointer)&(this->rt).super_Tracker.stare.field_2
  ;
  pcVar1 = (rt->super_Tracker).stare._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->rt).super_Tracker.stare,pcVar1,
             pcVar1 + (rt->super_Tracker).stare._M_string_length);
  (this->rt).super_Tracker._vptr_Tracker = (_func_int **)&PTR_getter_stare_abi_cxx11__0010dce0;
  (this->rt).nr_pagini = rt->nr_pagini;
  (this->md).super_Tracker._vptr_Tracker = (_func_int **)&PTR___cxa_pure_virtual_0010dc40;
  (this->md).super_Tracker.nume._M_dataplus._M_p = (pointer)&(this->md).super_Tracker.nume.field_2;
  pcVar1 = (md->super_Tracker).nume._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->md).super_Tracker.nume,pcVar1,
             pcVar1 + (md->super_Tracker).nume._M_string_length);
  (this->md).super_Tracker.stare._M_dataplus._M_p = (pointer)&(this->md).super_Tracker.stare.field_2
  ;
  pcVar1 = (md->super_Tracker).stare._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->md).super_Tracker.stare,pcVar1,
             pcVar1 + (md->super_Tracker).stare._M_string_length);
  (this->md).super_Tracker._vptr_Tracker = (_func_int **)&PTR_getter_stare_abi_cxx11__0010dd40;
  return;
}

Assistant:

Lista::Lista(const std::string &nume, const std::string &data, ReadingTracker &rt, MoodTracker &md) : nume(nume), data(data), rt(rt), md(md){}